

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QShaderDescription::InOutVariable>::moveAppend
          (QGenericArrayOps<QShaderDescription::InOutVariable> *this,InOutVariable *b,
          InOutVariable *e)

{
  qsizetype *pqVar1;
  InOutVariable *pIVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  int *piVar8;
  Data *pDVar9;
  BlockVariable *pBVar10;
  undefined8 uVar11;
  InOutVariable *pIVar12;
  int iVar13;
  ImageFlags IVar14;
  
  if ((b != e) && (b < e)) {
    pIVar2 = (this->super_QArrayDataPointer<QShaderDescription::InOutVariable>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QShaderDescription::InOutVariable>).size;
      pDVar4 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pIVar2[lVar3].name.d.d = pDVar4;
      pcVar5 = (b->name).d.ptr;
      (b->name).d.ptr = (char *)0x0;
      pIVar2[lVar3].name.d.ptr = pcVar5;
      qVar6 = (b->name).d.size;
      (b->name).d.size = 0;
      pIVar2[lVar3].name.d.size = qVar6;
      iVar13 = b->location;
      uVar11 = *(undefined8 *)&b->binding;
      pIVar12 = pIVar2 + lVar3;
      pIVar12->type = b->type;
      pIVar12->location = iVar13;
      *(undefined8 *)(&pIVar12->type + 2) = uVar11;
      IVar14.super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>.
      super_QFlagsStorage<QShaderDescription::ImageFlag>.i =
           (b->imageFlags).super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>;
      pIVar2[lVar3].imageFormat = b->imageFormat;
      pIVar2[lVar3].imageFlags =
           (ImageFlags)
           IVar14.super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>.
           super_QFlagsStorage<QShaderDescription::ImageFlag>.i;
      pDVar7 = (b->arrayDims).d.d;
      (b->arrayDims).d.d = (Data *)0x0;
      pIVar2[lVar3].arrayDims.d.d = pDVar7;
      piVar8 = (b->arrayDims).d.ptr;
      (b->arrayDims).d.ptr = (int *)0x0;
      pIVar2[lVar3].arrayDims.d.ptr = piVar8;
      qVar6 = (b->arrayDims).d.size;
      (b->arrayDims).d.size = 0;
      pIVar2[lVar3].arrayDims.d.size = qVar6;
      pIVar2[lVar3].perPatch = b->perPatch;
      pDVar9 = (b->structMembers).d.d;
      (b->structMembers).d.d = (Data *)0x0;
      pIVar2[lVar3].structMembers.d.d = pDVar9;
      pBVar10 = (b->structMembers).d.ptr;
      (b->structMembers).d.ptr = (BlockVariable *)0x0;
      pIVar2[lVar3].structMembers.d.ptr = pBVar10;
      qVar6 = (b->structMembers).d.size;
      (b->structMembers).d.size = 0;
      pIVar2[lVar3].structMembers.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QShaderDescription::InOutVariable>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }